

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O0

void SetGroups(int m,int ng,int *jg,int *jig,int *jr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int ngm1;
  int mper;
  int len1;
  int j;
  int ig;
  int *jr_local;
  int *jig_local;
  int *jg_local;
  int ng_local;
  int m_local;
  
  iVar2 = m / ng;
  for (ig = 0; ig < ng; ig = ig + 1) {
    jg[ig] = ig * iVar2;
  }
  jg[ng] = m;
  iVar3 = ng + -1;
  for (j = 0; iVar1 = iVar3 * iVar2, j < iVar3 * iVar2; j = j + 1) {
    jig[j] = j / iVar2;
  }
  while (j = iVar1, j < m) {
    jig[j] = iVar3;
    iVar1 = j + 1;
  }
  for (ig = 0; ig < iVar3; ig = ig + 1) {
    jr[ig] = ((ig * 2 + 1) * iVar2 + -1) / 2;
  }
  jr[iVar3] = (iVar3 * iVar2 + m + -1) / 2;
  return;
}

Assistant:

static void SetGroups(int m, int ng, int jg[], int jig[], int jr[])
{
  int ig, j, len1, mper, ngm1;

  mper = m / ng; /* does integer division */
  for (ig = 0; ig < ng; ig++) { jg[ig] = ig * mper; }
  jg[ng] = m;

  ngm1 = ng - 1;
  len1 = ngm1 * mper;
  for (j = 0; j < len1; j++) { jig[j] = j / mper; }
  for (j = len1; j < m; j++) { jig[j] = ngm1; }

  for (ig = 0; ig < ngm1; ig++) { jr[ig] = ((2 * ig + 1) * mper - 1) / 2; }
  jr[ngm1] = (ngm1 * mper + m - 1) / 2;
}